

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O0

bool LookupHelper<std::map<XOnlyPubKey,TaprootBuilder,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,TaprootBuilder>>>,XOnlyPubKey,TaprootBuilder>
               (map<XOnlyPubKey,_TaprootBuilder,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
                *map,XOnlyPubKey *key,TaprootBuilder *value)

{
  long lVar1;
  bool bVar2;
  TaprootBuilder *in_RDX;
  long in_FS_OFFSET;
  const_iterator it;
  key_type *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  map<XOnlyPubKey,_TaprootBuilder,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
  ::find((map<XOnlyPubKey,_TaprootBuilder,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
          *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8)
  ;
  std::
  map<XOnlyPubKey,_TaprootBuilder,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
  ::end((map<XOnlyPubKey,_TaprootBuilder,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
         *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  bVar2 = std::operator==((_Self *)in_RDX,
                          (_Self *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  bVar2 = ((bVar2 ^ 0xffU) & 1) != 0;
  if (bVar2) {
    std::_Rb_tree_const_iterator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_> *)
               in_stack_ffffffffffffffb8);
    TaprootBuilder::operator=
              (in_RDX,(TaprootBuilder *)
                      CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool LookupHelper(const M& map, const K& key, V& value)
{
    auto it = map.find(key);
    if (it != map.end()) {
        value = it->second;
        return true;
    }
    return false;
}